

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Linear_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Linear_Object_State_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pLVar3;
  string local_2c0 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::LinearSegmentParameter_*,_std::vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>_>
  local_2a0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Linear_Object_State_PDU *local_18;
  Linear_Object_State_PDU *this_local;
  
  local_18 = this;
  this_local = (Linear_Object_State_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Linear Object State PDU-\n");
  Object_State_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_Object_State_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Number Of Segments: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(ushort)(byte)(this->super_Object_State_Header).field_0x4b);
  poVar2 = std::operator<<(poVar2,"Requestor ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_ReqID);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Receiving ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_270,&this->m_RecvID);
  UTILS::IndentString(&local_250,&local_270,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"Object Type:  ");
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_((KString *)&citr,&this->m_ObjTyp);
  std::operator<<(poVar2,(string *)&citr);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
            ::begin(&this->m_vSegments);
  local_2a0._M_current =
       (LinearSegmentParameter *)
       std::
       vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
       ::end(&this->m_vSegments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_2a0);
    if (!bVar1) break;
    pLVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::LinearSegmentParameter_*,_std::vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>_>
             ::operator->(&citrEnd);
    (*(pLVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_2c0);
    std::operator<<(local_190,local_2c0);
    std::__cxx11::string::~string(local_2c0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::LinearSegmentParameter_*,_std::vector<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Linear_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Linear Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Number Of Segments: " << ( KUINT16 )m_ui8NumSegment
       << "Requestor ID:\n"  << IndentString( m_ReqID.GetAsString(), 1 )
       << "Receiving ID:\n"  << IndentString( m_RecvID.GetAsString(), 1 )
       << "Object Type:  "   << m_ObjTyp.GetAsString();

    vector<LinearSegmentParameter>::const_iterator citr = m_vSegments.begin();
    std::vector<LinearSegmentParameter>::const_iterator citrEnd = m_vSegments.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}